

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L.c
# Opt level: O2

int envy_bios_parse_bit_L(envy_bios *bios,envy_bios_bit_entry *bit)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  envy_bios_L_unk0_entry *peVar7;
  ulong uVar8;
  uint idx;
  
  (bios->L).bit = bit;
  idx = 0;
  do {
    iVar4 = parse_at(bios,idx,(char **)0x0);
    idx = idx + 1;
  } while (iVar4 == 0);
  uVar3 = (bios->L).unk0.offset;
  if (uVar3 != 0) {
    bios_u8(bios,(uint)uVar3,&(bios->L).unk0.version);
    uVar1 = (bios->L).unk0.version;
    if ((uVar1 == '@') || (uVar1 == '0')) {
      iVar4 = bios_u8(bios,(bios->L).unk0.offset + 1,&(bios->L).unk0.hlen);
      iVar5 = bios_u8(bios,(bios->L).unk0.offset + 2,&(bios->L).unk0.rlen);
      iVar6 = bios_u8(bios,(bios->L).unk0.offset + 3,&(bios->L).unk0.entriesnum);
      (bios->L).unk0.valid = iVar6 == 0 && (iVar5 == 0 && iVar4 == 0);
      bVar2 = (bios->L).unk0.entriesnum;
      peVar7 = (envy_bios_L_unk0_entry *)malloc((ulong)((uint)bVar2 * 2));
      (bios->L).unk0.entries = peVar7;
      for (uVar8 = 0; bVar2 != uVar8; uVar8 = uVar8 + 1) {
        peVar7[uVar8].offset =
             (short)uVar8 * (ushort)(bios->L).unk0.rlen +
             (ushort)(bios->L).unk0.hlen + (bios->L).unk0.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown L UNK0 table version 0x%x\n");
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_L(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_L *l = &bios->L;
	unsigned int idx = 0;

	l->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_L_unk0(bios);

	return 0;
}